

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O3

bool __thiscall
rapidjson::
Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
::WriteString(Writer<rapidjson::GenericStringBuffer<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>,_rapidjson::UTF8<char>,_rapidjson::UTF8<char>,_rapidjson::CrtAllocator>
              *this,Ch *str,SizeType length)

{
  byte bVar1;
  char cVar2;
  Stack<rapidjson::CrtAllocator> *pSVar3;
  char *pcVar4;
  byte *pbVar5;
  ulong uVar6;
  
  pSVar3 = &this->os_->stack_;
  pcVar4 = pSVar3->stackTop_;
  if (pSVar3->stackEnd_ <= pcVar4 + 1) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar3,1);
    pcVar4 = pSVar3->stackTop_;
  }
  pSVar3->stackTop_ = pcVar4 + 1;
  *pcVar4 = '\"';
  if (length != 0) {
    uVar6 = 0;
    do {
      bVar1 = str[uVar6];
      cVar2 = "uuuuuuuubtnufruuuuuuuuuuuuuuuuuu"[bVar1];
      pSVar3 = &this->os_->stack_;
      pbVar5 = (byte *)pSVar3->stackTop_;
      if (cVar2 == '\0') {
        if (pSVar3->stackEnd_ <= pbVar5 + 1) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar3,1);
          pbVar5 = (byte *)pSVar3->stackTop_;
        }
        pSVar3->stackTop_ = (char *)(pbVar5 + 1);
        *pbVar5 = bVar1;
      }
      else {
        if (pSVar3->stackEnd_ <= pbVar5 + 1) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar3,1);
          pbVar5 = (byte *)pSVar3->stackTop_;
        }
        pSVar3->stackTop_ = (char *)(pbVar5 + 1);
        *pbVar5 = 0x5c;
        pSVar3 = &this->os_->stack_;
        pcVar4 = pSVar3->stackTop_;
        if (pSVar3->stackEnd_ <= pcVar4 + 1) {
          internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar3,1);
          pcVar4 = pSVar3->stackTop_;
        }
        pSVar3->stackTop_ = pcVar4 + 1;
        *pcVar4 = cVar2;
        if (cVar2 == 'u') {
          pSVar3 = &this->os_->stack_;
          pcVar4 = pSVar3->stackTop_;
          if (pSVar3->stackEnd_ <= pcVar4 + 1) {
            internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar3,1);
            pcVar4 = pSVar3->stackTop_;
          }
          pSVar3->stackTop_ = pcVar4 + 1;
          *pcVar4 = '0';
          pSVar3 = &this->os_->stack_;
          pcVar4 = pSVar3->stackTop_;
          if (pSVar3->stackEnd_ <= pcVar4 + 1) {
            internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar3,1);
            pcVar4 = pSVar3->stackTop_;
          }
          pSVar3->stackTop_ = pcVar4 + 1;
          *pcVar4 = '0';
          pSVar3 = &this->os_->stack_;
          cVar2 = "0123456789ABCDEF"[bVar1 >> 4];
          pcVar4 = pSVar3->stackTop_;
          if (pSVar3->stackEnd_ <= pcVar4 + 1) {
            internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar3,1);
            pcVar4 = pSVar3->stackTop_;
          }
          pSVar3->stackTop_ = pcVar4 + 1;
          *pcVar4 = cVar2;
          pSVar3 = &this->os_->stack_;
          cVar2 = "0123456789ABCDEF"[bVar1 & 0xf];
          pcVar4 = pSVar3->stackTop_;
          if (pSVar3->stackEnd_ <= pcVar4 + 1) {
            internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar3,1);
            pcVar4 = pSVar3->stackTop_;
          }
          pSVar3->stackTop_ = pcVar4 + 1;
          *pcVar4 = cVar2;
        }
      }
      uVar6 = uVar6 + 1;
    } while (uVar6 < length);
  }
  pSVar3 = &this->os_->stack_;
  pcVar4 = pSVar3->stackTop_;
  if (pSVar3->stackEnd_ <= pcVar4 + 1) {
    internal::Stack<rapidjson::CrtAllocator>::Expand<char>(pSVar3,1);
    pcVar4 = pSVar3->stackTop_;
  }
  pSVar3->stackTop_ = pcVar4 + 1;
  *pcVar4 = '\"';
  return true;
}

Assistant:

bool WriteString(const Ch* str, SizeType length)  {
        static const char hexDigits[16] = { '0', '1', '2', '3', '4', '5', '6', '7', '8', '9', 'A', 'B', 'C', 'D', 'E', 'F' };
        static const char escape[256] = {
#define Z16 0,0,0,0,0,0,0,0,0,0,0,0,0,0,0,0
            //0    1    2    3    4    5    6    7    8    9    A    B    C    D    E    F
            'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'b', 't', 'n', 'u', 'f', 'r', 'u', 'u', // 00
            'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', 'u', // 10
              0,   0, '"',   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0, // 20
            Z16, Z16,                                                                       // 30~4F
              0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,   0,'\\',   0,   0,   0, // 50
            Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16, Z16                                // 60~FF
#undef Z16
        };

        os_->Put('\"');
        GenericStringStream<SourceEncoding> is(str);
        while (is.Tell() < length) {
            const Ch c = is.Peek();
            if (!TargetEncoding::supportUnicode && (unsigned)c >= 0x80) {
                // Unicode escaping
                unsigned codepoint;
                if (!SourceEncoding::Decode(is, &codepoint))
                    return false;
                os_->Put('\\');
                os_->Put('u');
                if (codepoint <= 0xD7FF || (codepoint >= 0xE000 && codepoint <= 0xFFFF)) {
                    os_->Put(hexDigits[(codepoint >> 12) & 15]);
                    os_->Put(hexDigits[(codepoint >>  8) & 15]);
                    os_->Put(hexDigits[(codepoint >>  4) & 15]);
                    os_->Put(hexDigits[(codepoint      ) & 15]);
                }
                else {
                    RAPIDJSON_ASSERT(codepoint >= 0x010000 && codepoint <= 0x10FFFF);
                    // Surrogate pair
                    unsigned s = codepoint - 0x010000;
                    unsigned lead = (s >> 10) + 0xD800;
                    unsigned trail = (s & 0x3FF) + 0xDC00;
                    os_->Put(hexDigits[(lead >> 12) & 15]);
                    os_->Put(hexDigits[(lead >>  8) & 15]);
                    os_->Put(hexDigits[(lead >>  4) & 15]);
                    os_->Put(hexDigits[(lead      ) & 15]);
                    os_->Put('\\');
                    os_->Put('u');
                    os_->Put(hexDigits[(trail >> 12) & 15]);
                    os_->Put(hexDigits[(trail >>  8) & 15]);
                    os_->Put(hexDigits[(trail >>  4) & 15]);
                    os_->Put(hexDigits[(trail      ) & 15]);                    
                }
            }
            else if ((sizeof(Ch) == 1 || (unsigned)c < 256) && escape[(unsigned char)c])  {
                is.Take();
                os_->Put('\\');
                os_->Put(escape[(unsigned char)c]);
                if (escape[(unsigned char)c] == 'u') {
                    os_->Put('0');
                    os_->Put('0');
                    os_->Put(hexDigits[(unsigned char)c >> 4]);
                    os_->Put(hexDigits[(unsigned char)c & 0xF]);
                }
            }
            else
                if (!Transcoder<SourceEncoding, TargetEncoding>::Transcode(is, *os_))
                    return false;
        }
        os_->Put('\"');
        return true;
    }